

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SyntaxNode *args_6;
  CoverageBinsSyntax *pCVar1;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor visitor;
  CoverageBinsArraySizeSyntax *local_70;
  Token local_68;
  Token local_58;
  Token local_48;
  CoverageIffClauseSyntax *local_38;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_48 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  local_58 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  local_68 = parsing::Token::deepClone((Token *)(__fn + 0x70),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x80) == (SyntaxNode *)0x0) {
    local_70 = (CoverageBinsArraySizeSyntax *)0x0;
  }
  else {
    local_70 = (CoverageBinsArraySizeSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x80),&visitor,(BumpAllocator *)__child_stack);
  }
  _visitor = parsing::Token::deepClone((Token *)(__fn + 0x88),(BumpAllocator *)__child_stack);
  args_6 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x98),&visitor_1,(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0xa0) == (SyntaxNode *)0x0) {
    local_38 = (CoverageIffClauseSyntax *)0x0;
  }
  else {
    local_38 = (CoverageIffClauseSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0xa0),&visitor_1,(BumpAllocator *)__child_stack);
  }
  _visitor_1 = parsing::Token::deepClone((Token *)(__fn + 0xa8),(BumpAllocator *)__child_stack);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::CoverageBinsSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::CoverageBinsArraySizeSyntax*,slang::parsing::Token,slang::syntax::CoverageBinInitializerSyntax&,slang::syntax::CoverageIffClauseSyntax*,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,&local_48,&local_58,&local_68,&local_70,
                      (Token *)&visitor,(CoverageBinInitializerSyntax *)args_6,&local_38,
                      (Token *)&visitor_1);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const CoverageBinsSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<CoverageBinsSyntax>(
        *deepClone(node.attributes, alloc),
        node.wildcard.deepClone(alloc),
        node.keyword.deepClone(alloc),
        node.name.deepClone(alloc),
        node.size ? deepClone(*node.size, alloc) : nullptr,
        node.equals.deepClone(alloc),
        *deepClone<CoverageBinInitializerSyntax>(*node.initializer, alloc),
        node.iff ? deepClone(*node.iff, alloc) : nullptr,
        node.semi.deepClone(alloc)
    );
}